

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscContext.h
# Opt level: O0

void __thiscall CNscContext::MarkGlobalIdentifierSymbol(CNscContext *this,NscSymbol *pSymbol)

{
  CNscContext *in_RDI;
  
  in_RDI->m_nGlobalIdentifierCount = in_RDI->m_nGlobalIdentifierCount + 1;
  if ((in_RDI->m_nMaxIdentifierCount <= in_RDI->m_nGlobalIdentifierCount) &&
     ((in_RDI->m_fWarnedTooManyIdentifiers & 1U) == 0)) {
    in_RDI->m_fWarnedTooManyIdentifiers = true;
    GenerateWarning(in_RDI,
                    "Number of identifiers exceeds the standard compiler\'s maximum internal limit (%d); the standard compiler may not be able to compile the script.  Consider removing excess functions, global variables, constants, or structure types."
                    ,(ulong)(uint)in_RDI->m_nMaxIdentifierCount);
  }
  return;
}

Assistant:

void MarkGlobalIdentifierSymbol (NscSymbol *pSymbol)
	{
		pSymbol;

		m_nGlobalIdentifierCount += 1;

		if (m_nGlobalIdentifierCount >= m_nMaxIdentifierCount &&
			m_fWarnedTooManyIdentifiers == false)
		{
			m_fWarnedTooManyIdentifiers = true;

			GenerateWarning (
				"Number of identifiers exceeds the standard compiler's maximum"
				" internal limit (%d); the standard compiler may not be able"
				" to compile the script.  Consider removing excess functions,"
				" global variables, constants, or structure types.",
				m_nMaxIdentifierCount);
		}
	}